

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_generate_mapping
               (uint64_t *cw_lens,uint64_t *syms,uint64_t *freq,uint64_t max_cw_length,uint64_t n)

{
  uint64_t uVar1;
  long lVar2;
  
  for (lVar2 = 1; lVar2 <= (int)max_cw_length; lVar2 = lVar2 + 1) {
    cw_lens[lVar2] = cw_lens[lVar2] + cw_lens[lVar2 + -1];
  }
  while (n = n - 1, -1 < (long)n) {
    uVar1 = cw_lens[freq[syms[n]] - 1];
    cw_lens[freq[syms[n]] - 1] = uVar1 + 1;
    syms[syms[n]] = uVar1;
  }
  return;
}

Assistant:

void shuff_generate_mapping(uint64_t* cw_lens, uint64_t* syms, uint64_t* freq,
    uint64_t max_cw_length, uint64_t n)
{
    int64_t i;

    for (i = 1; i <= (int)max_cw_length; i++)
        cw_lens[i] += cw_lens[i - 1];

    for (i = n - 1; i >= 0; i--) {
        syms[syms[i]] = cw_lens[freq[syms[i]] - 1]++;
    }
}